

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cpp.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerCPP::emit_push_constant_block(CompilerCPP *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t uVar2;
  mapped_type *pmVar3;
  CompilerError *this_00;
  spirv_cross local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [8];
  string instance_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [8];
  string buffer_name;
  allocator local_49;
  string local_48 [32];
  Bitset *local_28;
  Bitset *flags;
  SPIRType *type;
  SPIRVariable *var_local;
  CompilerCPP *this_local;
  
  type = (SPIRType *)var;
  var_local = (SPIRVariable *)this;
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).self);
  CompilerGLSL::add_resource_name(&this->super_CompilerGLSL,uVar2);
  uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).field_0xc);
  flags = (Bitset *)Compiler::get<spirv_cross::SPIRType>((Compiler *)this,uVar2);
  pmVar3 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,
                        &(type->super_IVariant).self);
  local_28 = &(pmVar3->decoration).decoration_flags;
  bVar1 = Bitset::get(local_28,0x21);
  if (!bVar1) {
    bVar1 = Bitset::get(local_28,0x22);
    if (!bVar1) {
      emit_block_struct(this,(SPIRType *)flags);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&flags->higher);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_80,this,(ulong)uVar2,1);
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type->super_IVariant).self);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[6])(local_a0,this,(ulong)uVar2,1);
      (*(this->super_CompilerGLSL).super_Compiler._vptr_Compiler[0x25])(local_c0,this,flags);
      CompilerGLSL::
      statement<char_const(&)[24],std::__cxx11::string&,std::__cxx11::string,char_const(&)[3],std::__cxx11::string&,char_const(&)[2]>
                (&this->super_CompilerGLSL,(char (*) [24])"internal::PushConstant<",local_80,
                 local_c0,(char (*) [3])0x5b3b22,local_a0,(char (*) [2])0x5b3b6f);
      ::std::__cxx11::string::~string((string *)local_c0);
      CompilerGLSL::
      statement_no_indent<char_const(&)[9],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&,char_const(&)[7]>
                (&this->super_CompilerGLSL,(char (*) [9])"#define ",local_a0,
                 (char (*) [9])" __res->",local_a0,(char (*) [7])0x5baa61);
      join<char_const(&)[26],std::__cxx11::string&,char_const(&)[3],char_const(&)[3]>
                (local_e0,(char (*) [26])"s.register_push_constant(",local_a0,(char (*) [3])0x5bf66e
                 ,(char (*) [3])0x5b3b6e);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back(&this->resource_registrations,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0);
      ::std::__cxx11::string::~string((string *)local_e0);
      CompilerGLSL::statement<char_const(&)[1]>(&this->super_CompilerGLSL,(char (*) [1])0x5ab0aa);
      ::std::__cxx11::string::~string((string *)local_a0);
      ::std::__cxx11::string::~string((string *)local_80);
      return;
    }
  }
  this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            (local_48,
             "Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. Remap to location with reflection API first or disable these decorations."
             ,&local_49);
  CompilerError::CompilerError(this_00,(string *)local_48);
  __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
}

Assistant:

void CompilerCPP::emit_push_constant_block(const SPIRVariable &var)
{
	add_resource_name(var.self);

	auto &type = get<SPIRType>(var.basetype);
	auto &flags = ir.meta[var.self].decoration.decoration_flags;
	if (flags.get(DecorationBinding) || flags.get(DecorationDescriptorSet))
		SPIRV_CROSS_THROW("Push constant blocks cannot be compiled to GLSL with Binding or Set syntax. "
		                  "Remap to location with reflection API first or disable these decorations.");

	emit_block_struct(type);
	auto buffer_name = to_name(type.self);
	auto instance_name = to_name(var.self);

	statement("internal::PushConstant<", buffer_name, type_to_array_glsl(type), "> ", instance_name, ";");
	statement_no_indent("#define ", instance_name, " __res->", instance_name, ".get()");
	resource_registrations.push_back(join("s.register_push_constant(", instance_name, "__", ");"));
	statement("");
}